

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base32.hpp
# Opt level: O2

back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
 __thiscall
pstore::base32::convert<std::back_insert_iterator<std::__cxx11::string>>
          (base32 *this,uint128 wide,
          back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          out)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_30;
  
  do {
    std::
    back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator=(&local_30,"abcdefghijklmnopqrstuvwxyz234567" + ((uint)this & 0x1f));
    this = (base32 *)((ulong)this >> 5 | (long)out.container << 0x3b);
    out.container = out.container >> 5;
  } while (this != (base32 *)0x0 ||
           out.container != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
          );
  return (back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          )in_RDX;
}

Assistant:

OutputIterator convert (uint128 const wide, OutputIterator out) {
            auto high = wide.high ();
            auto low = wide.low ();
            constexpr auto mask = (1U << 5) - 1U;
            PSTORE_ASSERT (mask == alphabet.size () - 1U);
            do {
                *(out++) = alphabet[low & mask];
                low >>= 5;
                low |= (high & mask) << (64 - 5);
                high >>= 5;
            } while ((low | high) != 0);
            return out;
        }